

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O1

POMCPPrior * __thiscall despot::BaseTag::CreatePOMCPPrior(BaseTag *this,string *name)

{
  int iVar1;
  POMCPPrior *this_00;
  ostream *poVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)name);
  if (iVar1 == 0) {
    this_00 = (POMCPPrior *)operator_new(0x78);
    despot::UniformPOMCPPrior::UniformPOMCPPrior
              ((UniformPOMCPPrior *)this_00,(DSPOMDP *)&this->super_BeliefMDP);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)name);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)name);
      if (iVar1 != 0) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Unsupported POMCP prior: ");
        poVar2 = std::operator<<(poVar2,(string *)name);
        std::endl<char,std::char_traits<char>>(poVar2);
        exit(1);
      }
    }
    this_00 = (POMCPPrior *)operator_new(0x80);
    despot::POMCPPrior::POMCPPrior(this_00,(DSPOMDP *)&this->super_BeliefMDP);
    *(undefined ***)this_00 = &PTR__POMCPPrior_0011f980;
    *(BaseTag **)(this_00 + 0x78) = this;
  }
  return this_00;
}

Assistant:

POMCPPrior* BaseTag::CreatePOMCPPrior(string name) const {
	if (name == "UNIFORM") {
		return new UniformPOMCPPrior(this);
	} else if (name == "DEFAULT" || name == "SHR") {
		return new TagPOMCPPrior(this);
	} else {
		cerr << "Unsupported POMCP prior: " << name << endl;
		exit(1);
		return NULL;
	}
}